

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MetricsDiscoveryHelper.cpp
# Opt level: O0

void __thiscall
MetricsDiscovery::MDHelper::OpenStream
          (MDHelper *this,uint32_t timerPeriod,uint32_t bufferSize,uint32_t pid)

{
  long *plVar1;
  int iVar2;
  long lVar3;
  char *pcVar4;
  undefined4 in_ECX;
  int in_EDX;
  vector<char,_std::allocator<char>_> *in_RDI;
  uint32_t numReports;
  vector<char,_std::allocator<char>_> reportData;
  uint32_t reportSize;
  TCompletionCode res;
  TTypedValueLatest *oaBufferSize;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_10;
  undefined1 local_c [12];
  
  if (((((in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 & 1) != 0) &&
       (*(long *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl != 0)) &&
      (*(long *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 != 0))
     && ((*(uint *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc & 1)
         != 0)) {
    local_10 = in_EDX;
    if (in_EDX == 0) {
      plVar1 = *(long **)&in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10;
      lVar3 = (**(code **)(*plVar1 + 0x28))(plVar1,"OABufferMaxSize");
      if (lVar3 == 0) {
        local_10 = 0x400000;
      }
      else {
        local_10 = *(int *)(lVar3 + 8);
      }
    }
    plVar1 = *(long **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl;
    iVar2 = (**(code **)(*plVar1 + 0x20))
                      (plVar1,*(undefined8 *)
                               &in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x8,in_ECX,local_c,&local_10);
    if (iVar2 == 0) {
      (**(code **)(**(long **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               field_0x8 + 0x10))();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)0x275ce4);
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      plVar1 = *(long **)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl;
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x275d15);
      (**(code **)(*plVar1 + 0x28))(plVar1,&stack0xffffffffffffffb0,pcVar4,1);
      std::vector<char,_std::allocator<char>_>::~vector(in_RDI);
    }
  }
  return;
}

Assistant:

void MDHelper::OpenStream( uint32_t timerPeriod, uint32_t bufferSize, uint32_t pid )
{
    if( !m_Initialized || !m_ConcurrentGroup || !m_MetricSet )
    {
        DebugPrint("Can't OpenStream!\n");
        return;
    }

    if( !( m_APIMask & API_TYPE_IOSTREAM ) )
    {
        DebugPrint("OpenStream requires API_TYPE_IOSTREAM!\n");
        return;
    }

    if( bufferSize == 0 )
    {
        TTypedValueLatest* oaBufferSize = m_MetricsDevice->
            GetGlobalSymbolValueByName( "OABufferMaxSize" );
        if( oaBufferSize )
        {
            bufferSize = oaBufferSize->ValueUInt32;
            DebugPrint("Trying device maximum buffer size = %u bytes.\n", bufferSize);
        }
        else
        {
            bufferSize = 4 * 1024 * 1024;   // 4MB
            DebugPrint("Trying default maximum buffer size = %u bytes.\n", bufferSize);
        }
    }

    TCompletionCode res = m_ConcurrentGroup->OpenIoStream(
        m_MetricSet,
        pid,
        &timerPeriod,
        &bufferSize );
    if( res != CC_OK )
    {
        DebugPrint("OpenIoStream failed %d\n", res);
        return;
    }
    else
    {
        DebugPrint("OpenIoStream succeeded: timer period = %u ns, buffer size = %u bytes.\n",
            timerPeriod,
            bufferSize);
    }

    // Read a dummy report from the stream, to populate the metric names and units.
    const uint32_t  reportSize = m_MetricSet->GetParams()->RawReportSize;

    std::vector<char>   reportData;
    reportData.resize( reportSize );

    uint32_t    numReports = 1;
    res = m_ConcurrentGroup->ReadIoStream(
        &numReports,
        reportData.data(),
        IO_READ_FLAG_DROP_OLD_REPORTS );
    if( res != CC_OK && res != CC_READ_PENDING )
    {
        DebugPrint("Dummy ReadIoStream failed %d\n", res);
        return;
    }
}